

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_archive.cpp
# Opt level: O1

void __thiscall ON_3dmGoo::~ON_3dmGoo(ON_3dmGoo *this)

{
  ON_3dmGoo *pOVar1;
  
  pOVar1 = this->m_prev_goo;
  if (pOVar1 != (ON_3dmGoo *)0x0) {
    pOVar1->m_next_goo = this->m_next_goo;
  }
  if (this->m_next_goo != (ON_3dmGoo *)0x0) {
    this->m_next_goo->m_prev_goo = pOVar1;
  }
  if (this->m_goo != (uchar *)0x0) {
    onfree(this->m_goo);
    this->m_goo = (uchar *)0x0;
  }
  return;
}

Assistant:

ON_3dmGoo::~ON_3dmGoo()
{
  if ( m_prev_goo )
    m_prev_goo->m_next_goo = m_next_goo;
  if ( m_next_goo )
    m_next_goo->m_prev_goo = m_prev_goo;
  if ( m_goo ) {
    onfree(m_goo);
    m_goo = 0;
  }
}